

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

int __thiscall pbrt::SubSurfaceMaterial::writeTo(SubSurfaceMaterial *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  
  BinaryWriter::write(binary,(int)this + 0x18,in_RDX,in_RCX);
  BinaryWriter::writeRaw(binary,&this->uRoughness,4);
  BinaryWriter::writeRaw(binary,&this->vRoughness,4);
  BinaryWriter::writeRaw(binary,&this->remapRoughness,1);
  BinaryWriter::write(binary,(int)this + 0x48,__buf,in_RCX);
  return 0x12;
}

Assistant:

int SubSurfaceMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(uRoughness);
    binary.write(vRoughness);
    binary.write(remapRoughness);
    binary.write(name);
    return TYPE_SUBSURFACE_MATERIAL;
  }